

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmHttpSplitURI(SyhttpUri *pOut,char *zUri,sxu32 nLen)

{
  int *piVar1;
  char cVar2;
  sxi32 sVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  char *pcVar6;
  long lVar7;
  sxu32 nLen_00;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  sxu32 sVar12;
  char *pcVar13;
  int iVar14;
  long lStack_60;
  sxu32 nPos;
  char local_49;
  char *local_48;
  ulong local_40;
  uint local_38;
  sxu32 nPassOfft;
  
  uVar8 = (ulong)nLen;
  local_48 = zUri + uVar8;
  nPos = 0;
  SyZero(pOut,0x90);
  (pOut->sRaw).zString = zUri;
  (pOut->sRaw).nByte = nLen;
  uVar10 = nLen - 1;
  pcVar6 = zUri;
  local_40 = (ulong)nLen;
  while ((((int)uVar8 != 0 && (cVar2 = *pcVar6, (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0))
        ) {
    uVar8 = uVar8 - 1;
    (pOut->sRaw).nByte = (uint)uVar8;
    pcVar6 = pcVar6 + 1;
    (pOut->sRaw).zString = pcVar6;
    uVar10 = uVar10 - 1;
  }
  while (((uVar8 != 0 && (cVar2 = pcVar6[uVar10], (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0))
        ) {
    uVar8 = uVar8 - 1;
    (pOut->sRaw).nByte = (uint)uVar8;
    uVar10 = uVar10 - 1;
  }
  sVar3 = SyByteFind(zUri,(sxu32)local_40,0x2f,&nPos);
  local_40 = CONCAT44(local_40._4_4_,sVar3);
  pcVar6 = local_48;
  if (sVar3 != 0) goto LAB_0011fca2;
  pcVar9 = zUri + nPos;
  if ((ulong)nPos == 0) {
    if (pcVar9[1] != '/') goto LAB_0011fe74;
LAB_0011fecc:
    pcVar6 = local_48;
    zUri = pcVar9 + 2;
    sVar3 = SyByteFind(zUri,(int)local_48 - (int)zUri,0x2f,&nPos);
    if (sVar3 == 0) {
      pcVar6 = zUri + nPos;
    }
  }
  else {
    pcVar6 = pcVar9;
    if (pcVar9[-1] == ':') {
      (pOut->sScheme).zString = zUri;
      (pOut->sScheme).nByte = nPos - 1;
      pcVar13 = zUri + 1;
      uVar10 = nPos - 2;
      while (((uVar10 != 0xffffffff &&
              (cVar2 = pcVar13[-1], (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
             (ppuVar5 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0))) {
        (pOut->sScheme).nByte = uVar10;
        (pOut->sScheme).zString = pcVar13;
        pcVar13 = pcVar13 + 1;
        uVar10 = uVar10 - 1;
      }
      if (pcVar9[1] == '/') goto LAB_0011fecc;
      if (pcVar9[-1] == ':') goto LAB_0011fe74;
    }
    else if (pcVar9[1] == '/') goto LAB_0011fecc;
  }
LAB_0011fca2:
  iVar14 = (int)pcVar6;
  nLen_00 = iVar14 - (int)zUri;
  sVar3 = SyByteFind(zUri,nLen_00,0x40,&nPos);
  sVar12 = nPos;
  if (sVar3 == 0) {
    if (nPos == 0) {
      zUri = zUri + 1;
    }
    else {
      (pOut->sUser).zString = zUri;
      (pOut->sUser).nByte = nPos;
      sVar3 = SyByteFind(zUri,nLen_00,0x3a,&nPassOfft);
      if ((sVar3 == 0) && (nPassOfft < sVar12)) {
        (pOut->sUser).nByte = nPassOfft;
        (pOut->sPass).zString = zUri + (ulong)nPassOfft + 1;
        (pOut->sPass).nByte = ~nPassOfft + sVar12;
      }
      zUri = zUri + (sVar12 + 1);
    }
  }
  iVar11 = iVar14 - (int)zUri;
  local_38 = iVar11 - 2;
  lVar7 = 0;
  while ((pcVar9 = zUri + lVar7, pcVar9 < pcVar6 &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)*pcVar9 * 2 + 1) & 0x20) != 0
         ))) {
    lVar7 = lVar7 + 1;
  }
  (pOut->sHost).zString = pcVar9;
  sVar12 = iVar11 - (int)lVar7;
  (pOut->sHost).nByte = sVar12;
  local_49 = zUri[lVar7];
  if (local_49 == '[') {
    uVar8 = (ulong)local_38 - lVar7;
    pcVar9 = zUri + lVar7 + 2;
    (pOut->sHost).zString = zUri + lVar7 + 1;
    uVar10 = 0;
    while( true ) {
      sVar12 = (sxu32)uVar8;
      (pOut->sHost).nByte = uVar10;
      cVar2 = pcVar9[-1];
      if (((0xffffffffffffffbf < (ulong)(long)cVar2) ||
          (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x10) == 0)
          ) && (cVar2 != ':')) break;
      uVar10 = uVar10 + 1;
      uVar8 = (ulong)(sVar12 - 1);
      pcVar9 = pcVar9 + 1;
    }
    if (cVar2 != ']') {
      return -0x18;
    }
  }
  sVar3 = SyByteFind(pcVar9,sVar12,0x3a,&nPos);
  if (sVar3 == 0) {
    if (local_49 != '[') {
      (pOut->sHost).nByte = nPos;
    }
    (pOut->sPort).zString = pcVar9 + (nPos + 1);
    (pOut->sPort).nByte = iVar14 - (int)(pcVar9 + (nPos + 1));
  }
  pcVar9 = pcVar6;
  if ((int)local_40 != 0) {
    return 0;
  }
LAB_0011fe74:
  (pOut->sPath).zString = pcVar9;
  sVar12 = (int)local_48 - (int)pcVar9;
  (pOut->sPath).nByte = sVar12;
  if (sVar12 != 0) {
    sVar3 = SyByteFind(pcVar9,sVar12,0x3f,&nPos);
    if (sVar3 == 0) {
      (pOut->sPath).nByte = nPos;
      (pOut->sQuery).zString = pcVar9 + (nPos + 1);
      (pOut->sQuery).nByte = (int)local_48 - (int)(pcVar9 + (nPos + 1));
      lStack_60 = 0x30;
    }
    else {
      lStack_60 = 0x20;
    }
    sVar4 = SyByteFind(pcVar9,sVar12,0x23,&nPos);
    if (sVar4 == 0) {
      if (sVar3 == 0) {
        if (pcVar9 + nPos < *(char **)((long)&(pOut->sHost).zString + lStack_60)) {
          return -0xc;
        }
        piVar1 = (int *)((long)&(pOut->sHost).nByte + lStack_60);
        *piVar1 = *piVar1 + ((int)(pcVar9 + nPos) - (int)local_48);
      }
      else {
        *(sxu32 *)((long)&(pOut->sHost).nByte + lStack_60) = nPos;
      }
      (pOut->sFragment).zString = pcVar9 + (nPos + 1);
      (pOut->sFragment).nByte = (int)local_48 - (int)(pcVar9 + (nPos + 1));
    }
  }
  return 0;
}

Assistant:

static sxi32 VmHttpSplitURI(SyhttpUri *pOut, const char *zUri, sxu32 nLen)
 {
	 const char *zEnd = &zUri[nLen];
	 sxu8 bHostOnly = FALSE;
	 sxu8 bIPv6 = FALSE	; 
	 const char *zCur;
	 SyString *pComp;
	 sxu32 nPos = 0;
	 sxi32 rc;
	 /* Zero the structure first */
	 SyZero(pOut, sizeof(SyhttpUri));
	 /* Remove leading and trailing white spaces  */
	 SyStringInitFromBuf(&pOut->sRaw, zUri, nLen);
	 SyStringFullTrim(&pOut->sRaw);
	 /* Find the first '/' separator */
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc != SXRET_OK ){
		 /* Assume a host name only */
		 zCur = zEnd;
		 bHostOnly = TRUE;
		 goto ProcessHost;
	 }
	 zCur = &zUri[nPos];
	 if( zUri != zCur && zCur[-1] == ':' ){
		 /* Extract a scheme:
		  * Not that we can get an invalid scheme here.
		  * Fortunately the caller can discard any URI by comparing this scheme with its 
		  * registered schemes and will report the error as soon as his comparison function
		  * fail.
		  */
	 	pComp = &pOut->sScheme;
		SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri - 1));
		SyStringLeftTrim(pComp);		
	 }
	 if( zCur[1] != '/' ){
		 if( zCur == zUri || zCur[-1] == ':' ){
		  /* No authority */
		  goto PathSplit;
		}
		 /* There is something here , we will assume its an authority
		  * and someone has forgot the two prefix slashes "//", 
		  * sooner or later we will detect if we are dealing with a malicious
		  * user or not, but now assume we are dealing with an authority
		  * and let the caller handle all the validation process.
		  */
		 goto ProcessHost;
	 }	 
	 zUri = &zCur[2];
	 zCur = zEnd;
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc == SXRET_OK ){
		 zCur = &zUri[nPos];
	 }
 ProcessHost:
	 /* Extract user information if present */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), '@', &nPos);
	 if( rc == SXRET_OK ){
		 if( nPos > 0 ){
			 sxu32 nPassOfft; /* Password offset */
			 pComp = &pOut->sUser;
			 SyStringInitFromBuf(pComp, zUri, nPos);
			 /* Extract the password if available */
			 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPassOfft);
			 if( rc == SXRET_OK && nPassOfft < nPos){
				 pComp->nByte = nPassOfft;
				 pComp = &pOut->sPass;
				 pComp->zString = &zUri[nPassOfft+sizeof(char)];
				 pComp->nByte = nPos - nPassOfft - 1;
			 }
			 /* Update the cursor */
			 zUri = &zUri[nPos+1];
		 }else{
			 zUri++;
		 }
	 }
	 pComp = &pOut->sHost;
	 while( zUri < zCur && SyisSpace(zUri[0])){
		 zUri++;
	 }	
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri));
	 if( pComp->zString[0] == '[' ){
		 /* An IPv6 Address: Make a simple naive test
		  */
		 zUri++; pComp->zString++; pComp->nByte = 0;
		 while( ((unsigned char)zUri[0] < 0xc0 && SyisHex(zUri[0])) || zUri[0] == ':' ){
			 zUri++; pComp->nByte++;
		 }
		 if( zUri[0] != ']' ){
			 return SXERR_CORRUPT; /* Malformed IPv6 address */
		 }
		 zUri++;
		 bIPv6 = TRUE;
	 }
	 /* Extract a port number if available */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPos);
	 if( rc == SXRET_OK ){
		 if( bIPv6 == FALSE ){
			 pComp->nByte = (sxu32)(&zUri[nPos] - zUri);
		 }
		 pComp = &pOut->sPort;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zCur - &zUri[nPos+1]));	
	 }
	 if( bHostOnly == TRUE ){
		 return SXRET_OK;
	 }
PathSplit:
	 zUri = zCur;
	 pComp = &pOut->sPath;
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zEnd-zUri));
	 if( pComp->nByte == 0 ){
		 return SXRET_OK; /* Empty path */
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '?', &nPos) ){
		 pComp->nByte = nPos; /* Update path length */
		 pComp = &pOut->sQuery;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]));
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '#', &nPos) ){
		 /* Update path or query length */
		 if( pComp == &pOut->sPath ){
			 pComp->nByte = nPos;
		 }else{
			 if( &zUri[nPos] < (char *)SyStringData(pComp) ){
				 /* Malformed syntax : Query must be present before fragment */
				 return SXERR_SYNTAX;
			 }
			 pComp->nByte -= (sxu32)(zEnd - &zUri[nPos]);
		 }
		 pComp = &pOut->sFragment;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]))
	 }
	 return SXRET_OK;
 }